

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Identity.cpp
# Opt level: O0

void test_qclab_qgates_Identity<std::complex<float>>(void)

{
  undefined1 *this;
  allocator<std::complex<float>_> *this_00;
  initializer_list<std::complex<float>_> __l;
  initializer_list<std::complex<float>_> __l_00;
  bool bVar1;
  char *pcVar2;
  reference lhs;
  complex<float> *pcVar3;
  char *in_R9;
  string local_6c0;
  AssertHelper local_6a0;
  Message local_698;
  bool local_689;
  undefined1 local_688 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_658;
  Message local_650;
  bool local_641;
  undefined1 local_640 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_610;
  Message local_608;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__4;
  complex<float> local_5e0;
  complex<float> local_5d8;
  iterator local_5d0;
  size_type local_5c8;
  undefined1 local_5c0 [8];
  V check1;
  V vec1;
  Identity<std::complex<float>_> I0;
  complex<float> local_578;
  complex<float> local_570;
  iterator local_568;
  size_type local_560;
  undefined1 local_558 [8];
  V v1;
  AssertHelper local_520;
  Message local_518;
  bool local_509;
  undefined1 local_508 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4d8;
  Message local_4d0;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__2;
  Identity<std::complex<float>_> I2;
  Message local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_11;
  Message local_458;
  int local_450;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_10;
  stringstream qasm;
  ostream local_428 [376];
  AssertHelper local_2b0;
  Message local_2a8;
  complex<float> local_2a0;
  SquareMatrix<std::complex<float>_> local_298;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_9;
  Message local_270;
  complex<float> local_268;
  SquareMatrix<std::complex<float>_> local_260;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_8;
  Message local_238;
  complex<float> local_230;
  SquareMatrix<std::complex<float>_> local_228;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_7;
  Message local_200;
  complex<float> local_1f8;
  SquareMatrix<std::complex<float>_> local_1f0;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_6;
  Message local_1c8;
  int local_1c0;
  int local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_5;
  int qnew;
  Message local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  Message local_170;
  int local_164;
  size_type local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  vector<int,_std::allocator<int>_> qubits;
  Message local_128;
  int local_120;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  int local_f8;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78;
  Message local_70;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  Message local_48;
  int local_40 [5];
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Identity<std::complex<float>_> I;
  
  qclab::qgates::Identity<std::complex<float>_>::Identity
            ((Identity<std::complex<float>_> *)&gtest_ar.message_);
  local_2c = qclab::qgates::QGate1<std::complex<float>_>::nbQubits
                       ((QGate1<std::complex<float>_> *)&gtest_ar.message_);
  local_40[0] = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_28,"I.nbQubits()","1",&local_2c,local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_61 = qclab::qgates::Identity<std::complex<float>_>::fixed
                       ((Identity<std::complex<float>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_60,(AssertionResult *)"I.fixed()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,10,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  bVar1 = qclab::qgates::QGate1<std::complex<float>_>::controlled
                    ((QGate1<std::complex<float>_> *)&gtest_ar.message_);
  local_a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_a8,
               (AssertionResult *)"I.controlled()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_f4 = qclab::qgates::QGate1<std::complex<float>_>::qubit
                       ((QGate1<std::complex<float>_> *)&gtest_ar.message_);
  local_f8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f0,"I.qubit()","0",&local_f4,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)&gtest_ar.message_,2);
  local_11c = qclab::qgates::QGate1<std::complex<float>_>::qubit
                        ((QGate1<std::complex<float>_> *)&gtest_ar.message_);
  local_120 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_118,"I.qubit()","2",&local_11c,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_128);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  qclab::qgates::QGate1<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_,
             (QGate1<std::complex<float>_> *)&gtest_ar.message_);
  local_160 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_);
  local_164 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_158,"qubits.size()","1",&local_160,&local_164);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  lhs = std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_,0);
  local_18c = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_188,"qubits[0]","2",lhs,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe60,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe60);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 3;
  qclab::qgates::QGate1<std::complex<float>_>::setQubits
            ((QGate1<std::complex<float>_> *)&gtest_ar.message_,
             (int *)((long)&gtest_ar_5.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_1bc = qclab::qgates::QGate1<std::complex<float>_>::qubit
                        ((QGate1<std::complex<float>_> *)&gtest_ar.message_);
  local_1c0 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1b8,"I.qubit()","3",&local_1bc,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  qclab::qgates::Identity<std::complex<float>_>::matrix
            ((Identity<std::complex<float>_> *)&local_1f0);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()(&local_1f0,0,0);
  std::complex<float>::complex(&local_1f8,1.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_1e0,"I.matrix()(0,0)","T(1.0)",pcVar3,&local_1f8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  qclab::qgates::Identity<std::complex<float>_>::matrix
            ((Identity<std::complex<float>_> *)&local_228);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()(&local_228,1,0);
  std::complex<float>::complex(&local_230,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_218,"I.matrix()(1,0)","T(0.0)",pcVar3,&local_230);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  qclab::qgates::Identity<std::complex<float>_>::matrix
            ((Identity<std::complex<float>_> *)&local_260);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()(&local_260,0,1);
  std::complex<float>::complex(&local_268,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_250,"I.matrix()(0,1)","T(0.0)",pcVar3,&local_268);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  qclab::qgates::Identity<std::complex<float>_>::matrix
            ((Identity<std::complex<float>_> *)&local_298);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()(&local_298,1,1);
  std::complex<float>::complex(&local_2a0,1.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_288,"I.matrix()(1,1)","T(1.0)",pcVar3,&local_2a0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  qclab::qgates::QGate1<std::complex<float>_>::print
            ((QGate1<std::complex<float>_> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_10.message_);
  local_44c = qclab::qgates::Identity<std::complex<float>_>::toQASM
                        ((Identity<std::complex<float>_> *)&gtest_ar.message_,local_428,0);
  local_450 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_448,"I.toQASM( qasm )","0",&local_44c,&local_450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_470,"qasm.str()","\"\"",&local_490,(char (*) [1])0x69c4e1);
  std::__cxx11::string::~string((string *)&local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&I2.super_QGate1<std::complex<float>_>.qubit_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&I2.super_QGate1<std::complex<float>_>.qubit_,&local_498);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&I2.super_QGate1<std::complex<float>_>.qubit_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  qclab::qgates::Identity<std::complex<float>_>::Identity
            ((Identity<std::complex<float>_> *)&gtest_ar__2.message_);
  local_4c1 = qclab::QObject<std::complex<float>_>::operator==
                        ((QObject<std::complex<float>_> *)&gtest_ar.message_,
                         (QObject<std::complex<float>_> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_4c0,(AssertionResult *)"I == I2",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  bVar1 = qclab::QObject<std::complex<float>_>::operator!=
                    ((QObject<std::complex<float>_> *)&gtest_ar.message_,
                     (QObject<std::complex<float>_> *)&gtest_ar__2.message_);
  local_509 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_508,&local_509,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &v1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_508,
               (AssertionResult *)"I != I2","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    std::__cxx11::string::~string
              ((string *)
               &v1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  std::complex<float>::complex(&local_578,0.0,0.0);
  std::complex<float>::complex(&local_570,1.0,0.0);
  local_568 = &local_578;
  local_560 = 2;
  this = &I0.super_QGate1<std::complex<float>_>.field_0xf;
  std::allocator<std::complex<float>_>::allocator((allocator<std::complex<float>_> *)this);
  __l_00._M_len = local_560;
  __l_00._M_array = local_568;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_558,__l_00,
             (allocator_type *)this);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)&I0.super_QGate1<std::complex<float>_>.field_0xf);
  qclab::qgates::Identity<std::complex<float>_>::Identity
            ((Identity<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_558);
  qclab::qgates::Identity<std::complex<float>_>::apply
            ((Identity<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,1,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::complex<float>::complex(&local_5e0,0.0,0.0);
  std::complex<float>::complex(&local_5d8,1.0,0.0);
  local_5d0 = &local_5e0;
  local_5c8 = 2;
  this_00 = (allocator<std::complex<float>_> *)
            ((long)&gtest_ar__4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<std::complex<float>_>::allocator(this_00);
  __l._M_len = local_5c8;
  __l._M_array = local_5d0;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_5c0,__l,
             this_00);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_5f9 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_5c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_5f8,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_558);
  qclab::qgates::Identity<std::complex<float>_>::apply
            ((Identity<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,1,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_641 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_5c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_640,&local_641,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_640,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_558);
  qclab::qgates::Identity<std::complex<float>_>::apply
            ((Identity<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,1,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_689 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_5c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_688,&local_689,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6c0,(internal *)local_688,(AssertionResult *)"vec1 == check1","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
    testing::internal::AssertHelper::~AssertHelper(&local_6a0);
    std::__cxx11::string::~string((string *)&local_6c0);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_5c0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::Identity<std::complex<float>_>::~Identity
            ((Identity<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_558);
  qclab::qgates::Identity<std::complex<float>_>::~Identity
            ((Identity<std::complex<float>_> *)&gtest_ar__2.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_10.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_);
  qclab::qgates::Identity<std::complex<float>_>::~Identity
            ((Identity<std::complex<float>_> *)&gtest_ar.message_);
  return;
}

Assistant:

void test_qclab_qgates_Identity() {

  qclab::qgates::Identity< T >  I ;

  EXPECT_EQ( I.nbQubits() , 1 ) ;   // nbQubits
  EXPECT_TRUE( I.fixed() ) ;        // fixed
  EXPECT_FALSE( I.controlled() ) ;  // controlled

  // qubit
  EXPECT_EQ( I.qubit() , 0 ) ;
  I.setQubit( 2 ) ;
  EXPECT_EQ( I.qubit() , 2 ) ;

  // qubits
  auto qubits = I.qubits() ;
  EXPECT_EQ( qubits.size() , 1 ) ;
  EXPECT_EQ( qubits[0] , 2 ) ;
  int qnew = 3 ;
  I.setQubits( &qnew ) ;
  EXPECT_EQ( I.qubit() , 3 ) ;

  // matrix
  EXPECT_EQ( I.matrix()(0,0) , T(1.0) ) ;
  EXPECT_EQ( I.matrix()(1,0) , T(0.0) ) ;
  EXPECT_EQ( I.matrix()(0,1) , T(0.0) ) ;
  EXPECT_EQ( I.matrix()(1,1) , T(1.0) ) ;

  // print
  I.print() ;

  // toQASM
  std::stringstream qasm ;
  EXPECT_EQ( I.toQASM( qasm ) , 0 ) ;
  EXPECT_EQ( qasm.str() , "" ) ;

  // operators == and !=
  qclab::qgates::Identity< T > I2 ;
  EXPECT_TRUE( I == I2 ) ;
  EXPECT_FALSE( I != I2 ) ;

  // apply
  {
    using V = std::vector< T > ;
    const V v1 = { 0 , 1 } ;

    qclab::qgates::Identity< T >  I0( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    I0.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 0 , 1 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { I0.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    vec1 = v1 ;
    I0.apply( qclab::Op::Trans , 1 , vec1 ) ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { I0.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    vec1 = v1 ;
    I0.apply( qclab::Op::ConjTrans , 1 , vec1 ) ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { I0.apply_device( qclab::Op::ConjTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif
  }

}